

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O1

void __thiscall
chrono::ChLoaderUVWdistributed::ComputeQ
          (ChLoaderUVWdistributed *this,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ChVectorDynamic<> *pCVar1;
  element_type *peVar2;
  double *pdVar3;
  _func_int *p_Var4;
  double dVar5;
  ChVectorDynamic<> *pCVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  SrcEvaluatorType srcEvaluator;
  ChQuadratureTablesTetrahedron *pCVar12;
  ChQuadratureTablesTriangle *pCVar13;
  ChQuadratureTables *pCVar14;
  Index index;
  ulong uVar15;
  ulong uVar16;
  pointer pvVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  pointer pvVar21;
  pointer pvVar22;
  pointer pvVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ChVectorDynamic<> mNF;
  double detJ;
  ActualDstType actualDst;
  ChVectorDynamic<> mF;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  double local_80;
  ChVectorDynamic<> *local_78;
  pointer local_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  pointer local_58;
  pointer local_50;
  ChVectorDynamic<> *local_48;
  ChVectorDynamic<> *local_40;
  pointer local_38;
  
  pCVar1 = &(this->super_ChLoaderUVW).super_ChLoader.Q;
  peVar2 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = (**(code **)(*(long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78)) + 0x18
                      ))((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
  local_78 = pCVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar8);
  lVar20 = (this->super_ChLoaderUVW).super_ChLoader.Q.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < lVar20) {
    if (lVar20 != 0) {
      memset((local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar20 << 3);
    }
    peVar2 = (this->super_ChLoaderUVW).loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar8 = (**(code **)(*(long *)((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78)) +
                        0x38))((long)&peVar2->field_0x0 + *(long *)((long)*peVar2 + -0x78));
    local_68.m_storage.m_data = (double *)0x0;
    local_68.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,(long)iVar8);
    if (-1 < local_68.m_storage.m_rows) {
      if (local_68.m_storage.m_rows != 0) {
        memset(local_68.m_storage.m_data,0,local_68.m_storage.m_rows << 3);
      }
      cVar7 = (**(code **)((long)*(this->super_ChLoaderUVW).loadable.
                                  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x78))();
      local_48 = state_x;
      local_40 = state_w;
      if (cVar7 == '\0') {
        cVar7 = (**(code **)((long)*(this->super_ChLoaderUVW).loadable.
                                    super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x80))();
        p_Var4 = (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6];
        if (cVar7 == '\0') {
          iVar8 = (*p_Var4)();
          pCVar14 = ChQuadrature::GetStaticTables();
          if ((ulong)(((long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < (ulong)(long)iVar8) {
            __assert_fail("GetIntegrationPointsU() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x76,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])();
          pCVar14 = ChQuadrature::GetStaticTables();
          if ((ulong)(((long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < (ulong)(long)iVar8) {
            __assert_fail("GetIntegrationPointsV() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x77,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          pCVar14 = ChQuadrature::GetStaticTables();
          if ((ulong)(((long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < (ulong)(long)iVar8) {
            __assert_fail("GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x78,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          pvVar21 = (pCVar14->Lroots).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar8;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          local_50 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar8;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])();
          pvVar23 = (pCVar14->Lroots).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar8;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])();
          local_58 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar8;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          pvVar22 = (pCVar14->Lroots).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar8;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
          local_38 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar8;
          local_a8.m_storage.m_data = (double *)0x0;
          local_a8.m_storage.m_rows = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_a8,
                     (this->super_ChLoaderUVW).super_ChLoader.Q.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                    );
          pCVar1 = local_48;
          if (pvVar21[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              pvVar21[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar16 = 0;
            local_98 = pvVar22;
            local_88 = pvVar21;
            local_70 = pvVar23;
            do {
              if (pvVar23[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  pvVar23[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar15 = 0;
                do {
                  if (pvVar22[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      pvVar22[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    pvVar17 = (pointer)0x0;
                    do {
                      pCVar6 = local_40;
                      local_90 = pvVar17;
                      (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                                (this,&local_68,pCVar1,local_40);
                      peVar2 = (this->super_ChLoaderUVW).loadable.
                               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      (**(code **)((long)*peVar2 + 0x68))
                                (*(undefined8 *)
                                  (*(long *)&local_88[-1].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data + uVar16 * 8),
                                 *(undefined8 *)
                                  (*(long *)&local_70[-1].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data + uVar15 * 8),
                                 *(undefined8 *)
                                  (*(long *)&local_98[-1].
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data + (long)local_90 * 8),
                                 peVar2,&local_a8,&local_80,&local_68,pCVar1,pCVar6);
                      if (local_a8.m_storage.m_rows < 0) goto LAB_006ad17e;
                      dVar5 = local_80 *
                              *(double *)
                               (*(long *)&local_50[-1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + uVar16 * 8) *
                              *(double *)
                               (*(long *)&local_58[-1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + uVar15 * 8) *
                              *(double *)
                               (*(long *)&local_38[-1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl + (long)local_90 * 8);
                      uVar18 = local_a8.m_storage.m_rows & 0x7ffffffffffffff8;
                      if (7 < local_a8.m_storage.m_rows) {
                        auVar28._8_8_ = 0;
                        auVar28._0_8_ = dVar5;
                        auVar24 = vbroadcastsd_avx512f(auVar28);
                        uVar19 = 0;
                        do {
                          auVar25 = vmulpd_avx512f(auVar24,*(undefined1 (*) [64])
                                                            (local_a8.m_storage.m_data + uVar19));
                          *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar19) = auVar25;
                          uVar19 = uVar19 + 8;
                        } while (uVar19 < uVar18);
                      }
                      if ((long)uVar18 < local_a8.m_storage.m_rows) {
                        do {
                          local_a8.m_storage.m_data[uVar18] =
                               dVar5 * local_a8.m_storage.m_data[uVar18];
                          uVar18 = uVar18 + 1;
                        } while (local_a8.m_storage.m_rows != uVar18);
                      }
                      uVar18 = (this->super_ChLoaderUVW).super_ChLoader.Q.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows;
                      if (uVar18 != local_a8.m_storage.m_rows) goto LAB_006ad19d;
                      pdVar3 = (local_78->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data;
                      uVar19 = uVar18 + 7;
                      if (-1 < (long)uVar18) {
                        uVar19 = uVar18;
                      }
                      uVar19 = uVar19 & 0xfffffffffffffff8;
                      if (7 < (long)uVar18) {
                        lVar20 = 0;
                        do {
                          auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                    (local_a8.m_storage.m_data + lVar20),
                                                   *(undefined1 (*) [64])(pdVar3 + lVar20));
                          *(undefined1 (*) [64])(pdVar3 + lVar20) = auVar24;
                          lVar20 = lVar20 + 8;
                        } while (lVar20 < (long)uVar19);
                      }
                      if ((long)uVar19 < (long)uVar18) {
                        do {
                          pdVar3[uVar19] = local_a8.m_storage.m_data[uVar19] + pdVar3[uVar19];
                          uVar19 = uVar19 + 1;
                        } while (uVar18 != uVar19);
                      }
                      pvVar17 = (pointer)(ulong)((int)local_90 + 1);
                      pvVar22 = local_98;
                      pvVar23 = local_70;
                      pvVar21 = local_88;
                    } while (pvVar17 < (pointer)((long)local_98[-1].
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 *(long *)&local_98[-1].
                                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data >> 3));
                  }
                  uVar15 = (ulong)((int)uVar15 + 1);
                } while (uVar15 < (ulong)((long)pvVar23[-1].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          *(long *)&pvVar23[-1].
                                                                                                        
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data >> 3));
              }
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (uVar16 < (ulong)((long)pvVar21[-1].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      *(long *)&pvVar21[-1].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data >> 3));
          }
        }
        else {
          iVar8 = (*p_Var4)();
          pCVar13 = ChQuadrature::GetStaticTablesTriangle();
          if ((ulong)(((long)(pCVar13->Weight).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar13->Weight).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < (ulong)(long)iVar8) {
            __assert_fail("GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTriangle()->Weight.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x5a,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          pCVar13 = ChQuadrature::GetStaticTablesTriangle();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          pvVar23 = (pCVar13->LrootsU).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar8;
          pCVar13 = ChQuadrature::GetStaticTablesTriangle();
          iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          pvVar22 = (pCVar13->LrootsV).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pCVar13 = ChQuadrature::GetStaticTablesTriangle();
          iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          local_50 = (pCVar13->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar9;
          iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          pCVar14 = ChQuadrature::GetStaticTables();
          if ((ulong)(((long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar14->Lroots).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              < (ulong)(long)iVar9) {
            __assert_fail("GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x5e,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          local_88 = (pCVar14->Lroots).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar9;
          pCVar14 = ChQuadrature::GetStaticTables();
          iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
          local_58 = (pCVar14->Weight).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar9;
          local_a8.m_storage.m_data = (double *)0x0;
          local_a8.m_storage.m_rows = 0;
          local_70 = pvVar22 + iVar8;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_a8,
                     (this->super_ChLoaderUVW).super_ChLoader.Q.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                    );
          pCVar6 = local_40;
          pCVar1 = local_48;
          pvVar22 = local_70;
          if (pvVar23[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              pvVar23[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar16 = 0;
            local_98 = pvVar23;
            do {
              if (local_88[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_88[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pvVar21 = (pointer)0x0;
                do {
                  local_90 = pvVar21;
                  (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                            (this,&local_68,pCVar1,pCVar6);
                  peVar2 = (this->super_ChLoaderUVW).loadable.
                           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  lVar20 = *(long *)&pvVar22[-1].super__Vector_base<double,_std::allocator<double>_>
                                     ._M_impl.super__Vector_impl_data;
                  (**(code **)((long)*peVar2 + 0x68))
                            (*(undefined8 *)
                              (*(long *)&local_98[-1].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + uVar16 * 8),
                             *(undefined8 *)(lVar20 + uVar16 * 8),
                             *(undefined8 *)(lVar20 + (long)local_90 * 8),peVar2,&local_a8,&local_80
                             ,&local_68,pCVar1,pCVar6);
                  dVar5 = local_80 *
                          *(double *)
                           (*(long *)&local_50[-1].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           uVar16 * 8) *
                          *(double *)
                           (*(long *)&local_58[-1].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           (long)local_90 * 8) * 0.5;
                  if (local_a8.m_storage.m_rows < 0) goto LAB_006ad17e;
                  uVar15 = local_a8.m_storage.m_rows & 0x7ffffffffffffff8;
                  if (7 < local_a8.m_storage.m_rows) {
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = dVar5;
                    auVar24 = vbroadcastsd_avx512f(auVar27);
                    uVar18 = 0;
                    do {
                      auVar25 = vmulpd_avx512f(auVar24,*(undefined1 (*) [64])
                                                        (local_a8.m_storage.m_data + uVar18));
                      *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar18) = auVar25;
                      uVar18 = uVar18 + 8;
                    } while (uVar18 < uVar15);
                  }
                  if ((long)uVar15 < local_a8.m_storage.m_rows) {
                    do {
                      local_a8.m_storage.m_data[uVar15] = dVar5 * local_a8.m_storage.m_data[uVar15];
                      uVar15 = uVar15 + 1;
                    } while (local_a8.m_storage.m_rows != uVar15);
                  }
                  uVar15 = (this->super_ChLoaderUVW).super_ChLoader.Q.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_rows;
                  if (uVar15 != local_a8.m_storage.m_rows) goto LAB_006ad19d;
                  pdVar3 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           ).m_storage.m_data;
                  uVar18 = uVar15 + 7;
                  if (-1 < (long)uVar15) {
                    uVar18 = uVar15;
                  }
                  uVar18 = uVar18 & 0xfffffffffffffff8;
                  if (7 < (long)uVar15) {
                    lVar20 = 0;
                    do {
                      auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                (local_a8.m_storage.m_data + lVar20),
                                               *(undefined1 (*) [64])(pdVar3 + lVar20));
                      *(undefined1 (*) [64])(pdVar3 + lVar20) = auVar24;
                      lVar20 = lVar20 + 8;
                    } while (lVar20 < (long)uVar18);
                  }
                  if ((long)uVar18 < (long)uVar15) {
                    do {
                      pdVar3[uVar18] = local_a8.m_storage.m_data[uVar18] + pdVar3[uVar18];
                      uVar18 = uVar18 + 1;
                    } while (uVar15 != uVar18);
                  }
                  pvVar21 = (pointer)(ulong)((int)local_90 + 1);
                  pvVar23 = local_98;
                } while (pvVar21 < (pointer)((long)local_88[-1].
                                                                                                      
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             *(long *)&local_88[-1].
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data >> 3));
              }
              uVar16 = (ulong)((int)uVar16 + 1);
            } while (uVar16 < (ulong)((long)pvVar23[-1].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      *(long *)&pvVar23[-1].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data >> 3));
          }
        }
      }
      else {
        iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
        if ((ulong)(((long)(pCVar12->Weight).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar12->Weight).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <
            (ulong)(long)iVar8) {
          __assert_fail("GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTetrahedron()->Weight.size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                        ,0x44,
                        "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                       );
        }
        pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
        iVar8 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        pvVar22 = (pCVar12->LrootsU).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
        iVar9 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        pvVar23 = (pCVar12->LrootsV).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
        iVar10 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        pvVar21 = (pCVar12->LrootsW).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pCVar12 = ChQuadrature::GetStaticTablesTetrahedron();
        iVar11 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
        local_88 = (pCVar12->Weight).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar11;
        local_a8.m_storage.m_data = (double *)0x0;
        local_a8.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_a8,
                   (this->super_ChLoaderUVW).super_ChLoader.Q.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
        pCVar6 = local_40;
        pCVar1 = local_48;
        if (pvVar22[(long)iVar8 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            pvVar22[(long)iVar8 + -1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar16 = 0;
          local_98 = pvVar21 + iVar10;
          local_90 = pvVar23 + iVar9;
          do {
            (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                      (this,&local_68,pCVar1,pCVar6);
            peVar2 = (this->super_ChLoaderUVW).loadable.
                     super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (**(code **)((long)*peVar2 + 0x68))
                      (*(undefined8 *)
                        (*(long *)&pvVar22[(long)iVar8 + -1].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + uVar16 * 8),
                       *(undefined8 *)
                        (*(long *)&local_90[-1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data + uVar16 * 8),
                       *(undefined8 *)
                        (*(long *)&local_98[-1].super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data + uVar16 * 8),peVar2,&local_a8,
                       &local_80,&local_68,pCVar1,pCVar6);
            dVar5 = local_80 *
                    *(double *)
                     (*(long *)&local_88[-1].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + uVar16 * 8) * 0.16666666666666666;
            if (local_a8.m_storage.m_rows < 0) goto LAB_006ad17e;
            uVar15 = local_a8.m_storage.m_rows & 0x7ffffffffffffff8;
            if (7 < local_a8.m_storage.m_rows) {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = dVar5;
              auVar24 = vbroadcastsd_avx512f(auVar26);
              uVar18 = 0;
              do {
                auVar25 = vmulpd_avx512f(auVar24,*(undefined1 (*) [64])
                                                  (local_a8.m_storage.m_data + uVar18));
                *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar18) = auVar25;
                uVar18 = uVar18 + 8;
              } while (uVar18 < uVar15);
            }
            if ((long)uVar15 < local_a8.m_storage.m_rows) {
              do {
                local_a8.m_storage.m_data[uVar15] = dVar5 * local_a8.m_storage.m_data[uVar15];
                uVar15 = uVar15 + 1;
              } while (local_a8.m_storage.m_rows != uVar15);
            }
            uVar15 = (this->super_ChLoaderUVW).super_ChLoader.Q.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (uVar15 != local_a8.m_storage.m_rows) {
LAB_006ad19d:
              __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                           );
            }
            pdVar3 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            uVar18 = uVar15 + 7;
            if (-1 < (long)uVar15) {
              uVar18 = uVar15;
            }
            uVar18 = uVar18 & 0xfffffffffffffff8;
            if (7 < (long)uVar15) {
              lVar20 = 0;
              do {
                auVar24 = vaddpd_avx512f(*(undefined1 (*) [64])(local_a8.m_storage.m_data + lVar20),
                                         *(undefined1 (*) [64])(pdVar3 + lVar20));
                *(undefined1 (*) [64])(pdVar3 + lVar20) = auVar24;
                lVar20 = lVar20 + 8;
              } while (lVar20 < (long)uVar18);
            }
            if ((long)uVar18 < (long)uVar15) {
              do {
                pdVar3[uVar18] = local_a8.m_storage.m_data[uVar18] + pdVar3[uVar18];
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (uVar16 < (ulong)((long)pvVar22[(long)iVar8 + -1].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    *(long *)&pvVar22[(long)iVar8 + -1].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data >> 3));
        }
      }
      if (local_a8.m_storage.m_data != (double *)0x0) {
        free((void *)local_a8.m_storage.m_data[-1]);
      }
      if (local_68.m_storage.m_data != (double *)0x0) {
        free((void *)local_68.m_storage.m_data[-1]);
      }
      return;
    }
  }
LAB_006ad17e:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

virtual void ComputeQ(ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                          ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                          ) override {
        Q.setZero(loadable->LoadableGet_ndof_w());
        ChVectorDynamic<> mF(loadable->Get_field_ncoords());
        mF.setZero();

        if (loadable->IsTetrahedronIntegrationNeeded()) {
            // case of tetrahedron: use special 3d quadrature tables (given U,V,W orders, use the U only)
            assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTetrahedron()->Weight.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsU[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsV[GetIntegrationPointsU() - 1];
            const std::vector<double>& Wlroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsW[GetIntegrationPointsU() - 1];
            const std::vector<double>& weight =  ChQuadrature::GetStaticTablesTetrahedron()->Weight[GetIntegrationPointsU() - 1];

            ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

            // Gauss quadrature :  Q = sum (N'*F*detJ * wi * 1/6)   often detJ=6*tetrahedron volume
            for (unsigned int i = 0; i < Ulroots.size(); i++) {
                double detJ;
                // Compute F= F(u,v,w)
                this->ComputeF(Ulroots[i], Vlroots[i], Wlroots[i], mF, state_x, state_w);
                // Compute mNF= N(u,v,w)'*F
                loadable->ComputeNF(Ulroots[i], Vlroots[i], Wlroots[i], mNF, detJ, mF, state_x, state_w);
                // Compute Q+= mNF * detJ * wi * 1/6
                mNF *= (detJ * weight[i] * (1. / 6.));  // (the 1/6 coefficient is not in the table);
                Q += mNF;
            }
		}
		else if (loadable->IsTrianglePrismIntegrationNeeded()) {
			// Case of triangle prism: quadrature on u,v in [0..1] for the triangle, on w in [-1...+1] for thickness.
			assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTriangle()->Weight.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTablesTriangle()->LrootsU[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTablesTriangle()->LrootsV[GetIntegrationPointsU() - 1];
            const std::vector<double>& weight = ChQuadrature::GetStaticTablesTriangle()->Weight[GetIntegrationPointsU() - 1];
			assert(GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size());
			const std::vector<double>& Wlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsW() - 1];
            const std::vector<double>& Wweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsW() - 1];

			ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

			// Gauss quadrature :  Q = sum (N'*F*detJ * wi * wj *1/2)   often detJ= 2 * triangle area
			// This requires a single outer for loop over all triangle points, already queued in arrays Ulroots Vlroots, 
			// and an inner loop over thickness points Wlroots.
            for (unsigned int i = 0; i < Ulroots.size(); i++) {
				for (unsigned int iw = 0; iw < Wlroots.size(); iw++) {
					double detJ;
					// Compute F= F(u,v)
					this->ComputeF(Ulroots[i], Vlroots[i], Vlroots[iw], mF, state_x, state_w);
					// Compute mNF= N(u,v)'*F
					loadable->ComputeNF(Ulroots[i], Vlroots[i], Vlroots[iw], mNF, detJ, mF, state_x, state_w);
					// Compute Q+= mNF * detJ * wi *1/2
					mNF *= (detJ * weight[i] * Wweight[iw] * (1. / 2.));  // (the 1/2 coefficient is not in the triangle table);
					Q += mNF;
				}
            }
		}
		else {
            // Case of normal box isoparametric coords (default)
            assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTables()->Lroots.size());
            assert(GetIntegrationPointsV() <= ChQuadrature::GetStaticTables()->Lroots.size());
            assert(GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsU() - 1];
            const std::vector<double>& Uweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsV() - 1];
            const std::vector<double>& Vweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsV() - 1];
            const std::vector<double>& Wlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsW() - 1];
            const std::vector<double>& Wweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsW() - 1];

            ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

            // Gauss quadrature :  Q = sum (N'*F*detJ * wi*wj*wk)
            for (unsigned int iu = 0; iu < Ulroots.size(); iu++) {
                for (unsigned int iv = 0; iv < Vlroots.size(); iv++) {
                    for (unsigned int iw = 0; iw < Wlroots.size(); iw++) {
                        double detJ;
                        // Compute F= F(u,v,w)
                        this->ComputeF(Ulroots[iu], Vlroots[iv], Wlroots[iw], mF, state_x, state_w);
                        // Compute mNF= N(u,v,w)'*F
                        loadable->ComputeNF(Ulroots[iu], Vlroots[iv], Wlroots[iw], mNF, detJ, mF, state_x,
                                            state_w);
                        // Compute Q+= mNF * detJ * wi*wj*wk
                        mNF *= (detJ * Uweight[iu] * Vweight[iv] * Wweight[iw]);
                        Q += mNF;
                    }
                }
            }
        }  
    }